

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O3

int __thiscall
vkt::memory::anon_unknown_0::BufferCopyToBuffer::verify
          (BufferCopyToBuffer *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  size_type *psVar1;
  byte bVar2;
  VkCommandBuffer_s VVar3;
  long lVar4;
  DeviceInterface *vkd;
  VkDevice device;
  VkQueue queue;
  VkResult VVar5;
  uint uVar6;
  long *plVar7;
  undefined8 *puVar8;
  long *plVar9;
  ulong *puVar10;
  ulong uVar11;
  ulong uVar12;
  long *local_390;
  undefined8 local_388;
  long local_380;
  undefined8 uStack_378;
  long *local_370;
  undefined8 local_368;
  long local_360;
  undefined8 uStack_358;
  string local_350;
  ulong *local_330;
  long local_328;
  ulong local_320;
  long lStack_318;
  ulong *local_310;
  long local_308;
  ulong local_300;
  long lStack_2f8;
  ulong *local_2f0;
  long local_2e8;
  ulong local_2e0;
  long lStack_2d8;
  Hex<8UL> local_2d0;
  long local_2c8;
  ulong local_2c0 [2];
  Hex<8UL> local_2b0;
  long local_2a8;
  ulong local_2a0 [2];
  long *local_290;
  long local_288;
  long local_280;
  undefined4 uStack_278;
  undefined4 uStack_274;
  ulong *local_270;
  long local_268;
  ulong local_260 [2];
  long *local_250;
  long local_248;
  long local_240;
  long lStack_238;
  ResultCollector *local_230;
  VkCommandBuffer local_228;
  DeviceInterface *pDStack_220;
  undefined4 local_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  long *local_200 [2];
  long local_1f0 [2];
  Move<vk::VkCommandBuffer_s_*> local_1e0 [3];
  ios_base local_170 [264];
  undefined4 local_68 [2];
  undefined8 local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  deUint64 local_48;
  undefined8 local_40;
  undefined8 local_38;
  VkCommandBuffer_s *commandBuffer;
  
  local_230 = *(ResultCollector **)(ctx + 8);
  lVar4 = *(long *)(ctx + 0x10);
  vkd = *(DeviceInterface **)(lVar4 + 8);
  device = *(VkDevice *)(lVar4 + 0x18);
  queue = *(VkQueue *)(lVar4 + 0x20);
  createBeginCommandBuffer
            (local_1e0,vkd,device,(VkCommandPool)*(deUint64 *)(lVar4 + 0x48),
             (VkCommandBufferLevel)tbs);
  commandBuffer = local_1e0[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  local_218 = local_1e0[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device._0_4_;
  uStack_214 = local_1e0[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device._4_4_;
  uStack_210 = (undefined4)
               local_1e0[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal;
  uStack_20c = local_1e0[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal.
               _4_4_;
  local_228 = local_1e0[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  pDStack_220 = local_1e0[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface;
  local_68[0] = 0x2c;
  local_60 = 0;
  local_58 = 0x1000;
  uStack_54 = 0x2000;
  uStack_50 = 0xffffffff;
  uStack_4c = 0xffffffff;
  local_48 = (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal;
  local_40 = 0;
  local_38 = 0xffffffffffffffff;
  (*vkd->_vptr_DeviceInterface[0x6d])
            (vkd,local_1e0[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0x1000,0x4000,0,0
             ,0,1,local_68,0,0);
  VVar5 = (*vkd->_vptr_DeviceInterface[0x4a])(vkd,commandBuffer);
  ::vk::checkResult(VVar5,"vkd.endCommandBuffer(*commandBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryPipelineBarrierTests.cpp"
                    ,0x92f);
  queueRun(vkd,queue,commandBuffer);
  VVar5 = (*vkd->_vptr_DeviceInterface[7])
                    (vkd,device,
                     (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.
                     m_internal,0,this->m_bufferSize,0,local_1e0);
  ::vk::checkResult(VVar5,"vkd.mapMemory(device, memory, 0, size, 0, &ptr)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryPipelineBarrierTests.cpp"
                    ,0x2b3);
  ::vk::invalidateMappedMemoryRange
            (vkd,device,
             (VkDeviceMemory)
             (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal
             ,0,this->m_bufferSize);
  if (this->m_bufferSize != 0) {
    uVar11 = 0;
    do {
      if (((*(ulong *)(*(long *)(ctx + 0x30) + (uVar11 >> 6) * 8) >> (uVar11 & 0x3f) & 1) != 0) &&
         (local_1e0[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object[uVar11] !=
          *(VkCommandBuffer_s *)(*(long *)(ctx + 0x18) + uVar11))) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1e0);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
        std::ios_base::~ios_base(local_170);
        plVar7 = (long *)std::__cxx11::string::append((char *)local_200);
        local_290 = &local_280;
        plVar9 = plVar7 + 2;
        if ((long *)*plVar7 == plVar9) {
          local_280 = *plVar9;
          uStack_278 = (undefined4)plVar7[3];
          uStack_274 = *(undefined4 *)((long)plVar7 + 0x1c);
        }
        else {
          local_280 = *plVar9;
          local_290 = (long *)*plVar7;
        }
        local_288 = plVar7[1];
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        (*(this->super_CmdCommand)._vptr_CmdCommand[2])(this);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_290);
        local_250 = &local_240;
        plVar9 = plVar7 + 2;
        if ((long *)*plVar7 == plVar9) {
          local_240 = *plVar9;
          lStack_238 = plVar7[3];
        }
        else {
          local_240 = *plVar9;
          local_250 = (long *)*plVar7;
        }
        local_248 = plVar7[1];
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_250);
        puVar10 = (ulong *)(plVar7 + 2);
        if ((ulong *)*plVar7 == puVar10) {
          local_320 = *puVar10;
          lStack_318 = plVar7[3];
          local_330 = &local_320;
        }
        else {
          local_320 = *puVar10;
          local_330 = (ulong *)*plVar7;
        }
        local_328 = plVar7[1];
        *plVar7 = (long)puVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        bVar2 = *(byte *)(*(long *)(ctx + 0x18) + uVar11);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
        local_2b0.value = (deUint64)(ulong)bVar2;
        tcu::Format::Hex<8UL>::toStream(&local_2b0,(ostream *)local_1e0);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
        std::ios_base::~ios_base(local_170);
        uVar12 = 0xf;
        if (local_330 != &local_320) {
          uVar12 = local_320;
        }
        if (uVar12 < (ulong)(local_268 + local_328)) {
          uVar12 = 0xf;
          if (local_270 != local_260) {
            uVar12 = local_260[0];
          }
          if (uVar12 < (ulong)(local_268 + local_328)) goto LAB_006524bc;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_330);
        }
        else {
LAB_006524bc:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_270);
        }
        local_390 = &local_380;
        plVar7 = puVar8 + 2;
        if ((long *)*puVar8 == plVar7) {
          local_380 = *plVar7;
          uStack_378 = puVar8[3];
        }
        else {
          local_380 = *plVar7;
          local_390 = (long *)*puVar8;
        }
        local_388 = puVar8[1];
        *puVar8 = plVar7;
        puVar8[1] = 0;
        *(undefined1 *)plVar7 = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_390);
        puVar10 = (ulong *)(plVar7 + 2);
        if ((ulong *)*plVar7 == puVar10) {
          local_300 = *puVar10;
          lStack_2f8 = plVar7[3];
          local_310 = &local_300;
        }
        else {
          local_300 = *puVar10;
          local_310 = (ulong *)*plVar7;
        }
        local_308 = plVar7[1];
        *plVar7 = (long)puVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        VVar3 = local_1e0[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object[uVar11];
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
        local_2d0.value = (deUint64)(ulong)(byte)VVar3;
        tcu::Format::Hex<8UL>::toStream(&local_2d0,(ostream *)local_1e0);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
        std::ios_base::~ios_base(local_170);
        uVar11 = 0xf;
        if (local_310 != &local_300) {
          uVar11 = local_300;
        }
        if (uVar11 < (ulong)(local_2a8 + local_308)) {
          uVar11 = 0xf;
          if ((ulong *)local_2b0.value != local_2a0) {
            uVar11 = local_2a0[0];
          }
          if (uVar11 < (ulong)(local_2a8 + local_308)) goto LAB_0065263e;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_310);
        }
        else {
LAB_0065263e:
          puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_310,local_2b0.value)
          ;
        }
        local_370 = &local_360;
        plVar7 = puVar8 + 2;
        if ((long *)*puVar8 == plVar7) {
          local_360 = *plVar7;
          uStack_358 = puVar8[3];
        }
        else {
          local_360 = *plVar7;
          local_370 = (long *)*puVar8;
        }
        local_368 = puVar8[1];
        *puVar8 = plVar7;
        puVar8[1] = 0;
        *(undefined1 *)plVar7 = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_370);
        puVar10 = (ulong *)(plVar7 + 2);
        if ((ulong *)*plVar7 == puVar10) {
          local_2e0 = *puVar10;
          lStack_2d8 = plVar7[3];
          local_2f0 = &local_2e0;
        }
        else {
          local_2e0 = *puVar10;
          local_2f0 = (ulong *)*plVar7;
        }
        local_2e8 = plVar7[1];
        *plVar7 = (long)puVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1e0);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
        std::ios_base::~ios_base(local_170);
        uVar11 = 0xf;
        if (local_2f0 != &local_2e0) {
          uVar11 = local_2e0;
        }
        if (uVar11 < (ulong)(local_2c8 + local_2e8)) {
          uVar11 = 0xf;
          if ((ulong *)local_2d0.value != local_2c0) {
            uVar11 = local_2c0[0];
          }
          if (uVar11 < (ulong)(local_2c8 + local_2e8)) goto LAB_006527b7;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_2d0,0,(char *)0x0,(ulong)local_2f0);
        }
        else {
LAB_006527b7:
          puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2f0,local_2d0.value)
          ;
        }
        local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
        psVar1 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_350.field_2._M_allocated_capacity = *psVar1;
          local_350.field_2._8_8_ = puVar8[3];
        }
        else {
          local_350.field_2._M_allocated_capacity = *psVar1;
          local_350._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_350._M_string_length = puVar8[1];
        *puVar8 = psVar1;
        puVar8[1] = 0;
        *(undefined1 *)psVar1 = 0;
        tcu::ResultCollector::fail(local_230,&local_350);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_dataplus._M_p != &local_350.field_2) {
          operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
        }
        if ((ulong *)local_2d0.value != local_2c0) {
          operator_delete((void *)local_2d0.value,local_2c0[0] + 1);
        }
        if (local_2f0 != &local_2e0) {
          operator_delete(local_2f0,local_2e0 + 1);
        }
        if (local_370 != &local_360) {
          operator_delete(local_370,local_360 + 1);
        }
        if ((ulong *)local_2b0.value != local_2a0) {
          operator_delete((void *)local_2b0.value,local_2a0[0] + 1);
        }
        if (local_310 != &local_300) {
          operator_delete(local_310,local_300 + 1);
        }
        if (local_390 != &local_380) {
          operator_delete(local_390,local_380 + 1);
        }
        if (local_270 != local_260) {
          operator_delete(local_270,local_260[0] + 1);
        }
        if (local_330 != &local_320) {
          operator_delete(local_330,local_320 + 1);
        }
        if (local_250 != &local_240) {
          operator_delete(local_250,local_240 + 1);
        }
        if (local_290 != &local_280) {
          operator_delete(local_290,local_280 + 1);
        }
        if (local_200[0] != local_1f0) {
          operator_delete(local_200[0],local_1f0[0] + 1);
        }
        break;
      }
      uVar11 = uVar11 + 1;
    } while (this->m_bufferSize != uVar11);
  }
  (*vkd->_vptr_DeviceInterface[8])
            (vkd,device,
             (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal
            );
  if (commandBuffer != (VkCommandBuffer)0x0) {
    uVar6 = (*pDStack_220->_vptr_DeviceInterface[0x48])
                      (pDStack_220,CONCAT44(uStack_214,local_218),CONCAT44(uStack_20c,uStack_210),1)
    ;
    commandBuffer = (VkCommandBuffer_s *)(ulong)uVar6;
  }
  return (int)commandBuffer;
}

Assistant:

void BufferCopyToBuffer::verify (VerifyContext& context, size_t commandIndex)
{
	tcu::ResultCollector&					resultCollector	(context.getResultCollector());
	ReferenceMemory&						reference		(context.getReference());
	const vk::DeviceInterface&				vkd				= context.getContext().getDeviceInterface();
	const vk::VkDevice						device			= context.getContext().getDevice();
	const vk::VkQueue						queue			= context.getContext().getQueue();
	const vk::VkCommandPool					commandPool		= context.getContext().getCommandPool();
	const vk::Unique<vk::VkCommandBuffer>	commandBuffer	(createBeginCommandBuffer(vkd, device, commandPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));
	const vk::VkBufferMemoryBarrier			barrier			=
	{
		vk::VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,
		DE_NULL,

		vk::VK_ACCESS_TRANSFER_WRITE_BIT,
		vk::VK_ACCESS_HOST_READ_BIT,

		VK_QUEUE_FAMILY_IGNORED,
		VK_QUEUE_FAMILY_IGNORED,
		*m_dstBuffer,
		0,
		VK_WHOLE_SIZE
	};

	vkd.cmdPipelineBarrier(*commandBuffer, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, vk::VK_PIPELINE_STAGE_HOST_BIT, (vk::VkDependencyFlags)0, 0, (const vk::VkMemoryBarrier*)DE_NULL, 1, &barrier, 0, (const vk::VkImageMemoryBarrier*)DE_NULL);

	VK_CHECK(vkd.endCommandBuffer(*commandBuffer));
	queueRun(vkd, queue, *commandBuffer);

	{
		void* const	ptr		= mapMemory(vkd, device, *m_memory, m_bufferSize);
		bool		isOk	= true;

		vk::invalidateMappedMemoryRange(vkd, device, *m_memory, 0, m_bufferSize);

		{
			const deUint8* const data = (const deUint8*)ptr;

			for (size_t pos = 0; pos < (size_t)m_bufferSize; pos++)
			{
				if (reference.isDefined(pos))
				{
					if (data[pos] != reference.get(pos))
					{
						resultCollector.fail(
								de::toString(commandIndex) + ":" + getName()
								+ " Result differs from reference, Expected: "
								+ de::toString(tcu::toHex<8>(reference.get(pos)))
								+ ", Got: "
								+ de::toString(tcu::toHex<8>(data[pos]))
								+ ", At offset: "
								+ de::toString(pos));
						break;
					}
				}
			}
		}

		vkd.unmapMemory(device, *m_memory);

		if (!isOk)
			context.getLog() << TestLog::Message << commandIndex << ": Buffer copy to buffer verification failed" << TestLog::EndMessage;
	}
}